

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void dictionary_unset(dictionary *d,char *key)

{
  char *__s2;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (d != (dictionary *)0x0 && key != (char *)0x0) {
    uVar1 = dictionary_hash(key);
    lVar3 = 0;
    lVar4 = d->size;
    if (d->size < 1) {
      lVar4 = lVar3;
    }
    for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      __s2 = d->key[lVar3];
      if (((__s2 != (char *)0x0) && (uVar1 == d->hash[lVar3])) &&
         (iVar2 = strcmp(key,__s2), iVar2 == 0)) {
        free(__s2);
        d->key[lVar3] = (char *)0x0;
        if (d->val[lVar3] != (char *)0x0) {
          free(d->val[lVar3]);
          d->val[lVar3] = (char *)0x0;
        }
        d->hash[lVar3] = 0;
        d->n = d->n + -1;
        return;
      }
    }
  }
  return;
}

Assistant:

void dictionary_unset(dictionary * d, const char * key)
{
    unsigned    hash ;
    ssize_t      i ;

    if (key == NULL || d == NULL) {
        return;
    }

    hash = dictionary_hash(key);
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        /* Compare hash */
        if (hash==d->hash[i]) {
            /* Compare string, to avoid hash collisions */
            if (!strcmp(key, d->key[i])) {
                /* Found key */
                break ;
            }
        }
    }
    if (i>=d->size)
        /* Key not found */
        return ;

    free(d->key[i]);
    d->key[i] = NULL ;
    if (d->val[i]!=NULL) {
        free(d->val[i]);
        d->val[i] = NULL ;
    }
    d->hash[i] = 0 ;
    d->n -- ;
    return ;
}